

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O1

void mpack_file_writer_teardown_close(mpack_writer_t *writer)

{
  int iVar1;
  
  if ((FILE *)writer->context != (FILE *)0x0) {
    iVar1 = fclose((FILE *)writer->context);
    if ((iVar1 != 0) && (writer->error == mpack_ok)) {
      writer->error = mpack_error_io;
      if (writer->error_fn != (mpack_writer_error_t)0x0) {
        (*writer->error_fn)(writer,mpack_error_io);
      }
    }
  }
  free(writer->buffer);
  writer->context = (void *)0x0;
  writer->buffer = (char *)0x0;
  return;
}

Assistant:

static void mpack_file_writer_teardown_close(mpack_writer_t* writer) {
    FILE* file = (FILE*)writer->context;

    if (file) {
        int ret = fclose(file);
        if (ret != 0)
            mpack_writer_flag_error(writer, mpack_error_io);
    }

    mpack_file_writer_teardown(writer);
}